

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

void __thiscall restincurl::Worker::WorkerThread::~WorkerThread(WorkerThread *this)

{
  pthread_t pVar1;
  pthread_t pVar2;
  
  pVar2 = (this->thread_)._M_id._M_thread;
  pVar1 = pthread_self();
  if (pVar2 == pVar1) {
    std::thread::detach();
    pVar2 = (this->thread_)._M_id._M_thread;
  }
  if (pVar2 == 0) {
    return;
  }
  std::terminate();
}

Assistant:

~WorkerThread() {
                if (thread_.get_id() == std::this_thread::get_id()) {
                    // Allow the thread to finish exiting the lambda
                    thread_.detach();
                }
            }